

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

int __thiscall
unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
remove(olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
      char *__filename)

{
  undefined1 *puVar1;
  byte bVar2;
  db_type *in_RDX;
  ulong uVar3;
  
  if (((undefined1  [704])
       this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_> &
      (undefined1  [704])0x2) != (undefined1  [704])0x0) {
    uVar3 = (ulong)__filename & 0xff;
    basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
    ::direct_remove_child_pointer
              (&this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>,
               (this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
               child_indexes._M_elems[uVar3].value.super___atomic_base<unsigned_char>._M_i,in_RDX);
    bVar2 = (this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
            child_indexes._M_elems[uVar3].value.super___atomic_base<unsigned_char>._M_i;
    *(undefined8 *)
     ((long)&(this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).children
     + (ulong)bVar2 * 8) = 0;
    (this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).child_indexes.
    _M_elems[uVar3].value.super___atomic_base<unsigned_char>._M_i = 0xff;
    puVar1 = &(this->super_olc_inode_48_parent<unsigned_long,_std::span<const_std::byte>_>).
              field_0x20;
    *puVar1 = *puVar1 + -1;
    return (int)bVar2;
  }
  __assert_fail("lock(*this).is_write_locked()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x50d,
                "void unodb::detail::olc_inode_48<unsigned long, std::span<const std::byte>>::remove(std::uint8_t, db_type &) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

void remove(std::uint8_t child_index, db_type& db_instance) noexcept {
    UNODB_DETAIL_ASSERT(lock(*this).is_write_locked());

    parent_class::remove(child_index, db_instance);
  }